

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlDOMWrapFreeCtxt(xmlDOMWrapCtxtPtr_conflict ctxt)

{
  xmlDOMWrapCtxtPtr_conflict ctxt_local;
  
  if (ctxt != (xmlDOMWrapCtxtPtr_conflict)0x0) {
    if (ctxt->namespaceMap != (void *)0x0) {
      xmlDOMWrapNsMapFree((xmlNsMapPtr)ctxt->namespaceMap);
    }
    (*xmlFree)(ctxt);
  }
  return;
}

Assistant:

void
xmlDOMWrapFreeCtxt(xmlDOMWrapCtxtPtr ctxt)
{
    if (ctxt == NULL)
	return;
    if (ctxt->namespaceMap != NULL)
	xmlDOMWrapNsMapFree((xmlNsMapPtr) ctxt->namespaceMap);
    /*
    * TODO: Store the namespace map in the context.
    */
    xmlFree(ctxt);
}